

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeStateApiTests.cpp
# Opt level: O2

void deqp::gles31::Functional::NegativeTestShared::get_booleanv(NegativeTestContext *ctx)

{
  allocator<char> local_31;
  GLboolean params;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&params,
             "GL_INVALID_ENUM is generated if pname is not one of the allowed values.",&local_31);
  NegativeTestContext::beginSection(ctx,(string *)&params);
  std::__cxx11::string::~string((string *)&params);
  params = '\0';
  glu::CallLogWrapper::glGetBooleanv(&ctx->super_CallLogWrapper,0xffffffff,&params);
  NegativeTestContext::expectError(ctx,0x500);
  NegativeTestContext::endSection(ctx);
  return;
}

Assistant:

void get_booleanv (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_ENUM is generated if pname is not one of the allowed values.");
	GLboolean params = GL_FALSE;
	ctx.glGetBooleanv(-1, &params);
	ctx.expectError(GL_INVALID_ENUM);
	ctx.endSection();
}